

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.cpp
# Opt level: O0

uint32_t __thiscall icu_63::CollationWeights::nextWeight(CollationWeights *this)

{
  int iVar1;
  uint32_t uVar2;
  WeightRange *pWVar3;
  uint32_t weight;
  WeightRange *range;
  CollationWeights *this_local;
  
  if (this->rangeIndex < this->rangeCount) {
    pWVar3 = this->ranges + this->rangeIndex;
    this_local._4_4_ = pWVar3->start;
    iVar1 = pWVar3->count + -1;
    pWVar3->count = iVar1;
    if (iVar1 == 0) {
      this->rangeIndex = this->rangeIndex + 1;
    }
    else {
      uVar2 = incWeight(this,this_local._4_4_,pWVar3->length);
      pWVar3->start = uVar2;
    }
  }
  else {
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t
CollationWeights::nextWeight() {
    if(rangeIndex >= rangeCount) {
        return 0xffffffff;
    } else {
        /* get the next weight */
        WeightRange &range = ranges[rangeIndex];
        uint32_t weight = range.start;
        if(--range.count == 0) {
            /* this range is finished */
            ++rangeIndex;
        } else {
            /* increment the weight for the next value */
            range.start = incWeight(weight, range.length);
            U_ASSERT(range.start <= range.end);
        }

        return weight;
    }
}